

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_dest.c
# Opt level: O0

int mpt_string_dest(mpt_strdest *addr,int sep,char *descr)

{
  ushort **ppuVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long val;
  size_t i;
  size_t max;
  size_t pos;
  char *end;
  char *descr_local;
  mpt_strdest *pmStack_18;
  int sep_local;
  mpt_strdest *addr_local;
  
  max = 0;
  i = (size_t)addr->change;
  end = descr;
  descr_local._4_4_ = sep;
  pmStack_18 = addr;
  if (i == 0) {
    i = 7;
  }
  else if (7 < i) {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
    return -1;
  }
  addr->change = '\0';
  if (descr == (char *)0x0) {
    addr_local._4_4_ = 0;
  }
  else {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*end] & 0x2000) != 0) {
      max = max + 1;
      end = end + 1;
    }
    for (val = 0; (ulong)val < i; val = val + 1) {
      lVar2 = strtol(end,(char **)&pos,0);
      if ((char *)pos == end) {
        if (*(char *)pos == '\0') break;
        if ((descr_local._4_4_ == 0) || (*(char *)pos != descr_local._4_4_)) {
          piVar3 = __errno_location();
          *piVar3 = 0x16;
          return -(int)max;
        }
        end = end + 1;
        max = max + 1;
        ppuVar1 = __ctype_b_loc();
        if (((*ppuVar1)[(int)*(char *)(pos + 1)] & 0x2000) != 0) break;
      }
      else {
        lVar4 = (pos - (long)end) + max;
        max._0_4_ = (int)lVar4;
        if ((lVar2 < 0) || (0xff < lVar2)) {
          piVar3 = __errno_location();
          *piVar3 = 0x22;
          return -(int)max;
        }
        pmStack_18->val[val] = (uint8_t)lVar2;
        pmStack_18->change = pmStack_18->change | (byte)(1 << ((byte)val & 0x1f));
        end = (char *)pos;
        if (((*(char *)pos == '\0') ||
            (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*end] & 0x2000) != 0)) ||
           (descr_local._4_4_ != *end)) break;
        end = end + 1;
        max = lVar4 + 1;
      }
    }
    addr_local._4_4_ = (int)max;
  }
  return addr_local._4_4_;
}

Assistant:

extern int mpt_string_dest(MPT_STRUCT(strdest) *addr, int sep, const char *descr)
{
	char *end;
	size_t pos = 0, max, i;
	long val;
	
	if (!(max = addr->change)) {
		max = sizeof(addr->val);
	}
	else if (max > sizeof(addr->val)) {
		errno = ERANGE; return -1;
	}
	addr->change = 0;
	
	if (!descr)
		return 0;
	
	while (isspace(*descr)) {
		pos++; descr++;
	}
	
	for (i = 0 ; i < max ; i++) {
		val = strtol(descr, &end, 0);
		if (end == descr) {
			if (!*end)
				break;
			
			if (sep && *end == sep) {
				descr++; pos++;
				if (isspace(end[1]))
					break;
				continue;
			}
			errno = EINVAL; return -pos;
		}
		pos += (end - descr);
		
		if (val < 0 || val > UINT8_MAX) {
			errno = ERANGE; return -pos;
		}
		addr->val[i] = val;
		addr->change |= 1 << i;
		
		if (!*(descr = end) || isspace(*descr) || sep != *descr)
			break;
		
		descr++; pos++;
	}
	return pos;
}